

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O3

void verify_vertical_down(Board *board,int row,int col,Ship *ship)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)ship->length + (long)row;
  if ((int)lVar2 <= board->row) {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(board->matrix).
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar2 + -1].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + (long)col * 0x20));
    if (iVar1 == 0) {
      uVar3 = (long)ship->length + (long)row;
      iVar1 = board->row;
      if ((int)uVar3 < iVar1) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)col * 0x20 +
                                   *(long *)&(board->matrix).
                                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data));
        if (iVar1 == 0) {
          ship->sRow = row;
          ship->sCol = col;
          goto LAB_0010285f;
        }
        iVar1 = board->row;
        uVar3 = (ulong)(uint)(ship->length + row);
      }
      ship->sRow = row;
      ship->sCol = col;
      if (iVar1 <= (int)uVar3) {
LAB_0010285f:
        ship->orientation = 'V';
        ship->direction = 2;
        return;
      }
      goto LAB_001027f0;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_001027f0:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_vertical_down( Board *board, int row, int col, Ship *ship )
{

	/*! Verifies whether the current position plus the rest of the ship (size - 1)
	 * 	exceeds the right border of the matrix or touches another ship
	 */
    if( ( row + ship->length - 1 <= board->row - 1 ) and ( board->matrix[row + ship->length - 1][col] == "~"  ) )
    {
        if( ( row + ship->length <= board->row - 1 ) and ( board->matrix[row + ship->length][col] == "~" ) )
        {
            ship->set_values( row, col, 'V', 2 );
        }
        else if( row + ship->length > board->row - 1 )
        {
            ship->set_values( row, col, 'V', 2 );
        }
        else
        {
            ship->set_values( row, col, 'N', 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N', 0 );
    }
}